

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O2

Span * __thiscall
tcmalloc::FixedAllocator<tcmalloc::Span>::Alloc(FixedAllocator<tcmalloc::Span> *this)

{
  void *result;
  Span *pSVar1;
  
  if (this->inited == false) {
    if (this->construct == false) {
      __assert_fail("construct",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                    ,0x18,
                    "T *tcmalloc::FixedAllocator<tcmalloc::Span>::Alloc() [T = tcmalloc::Span]");
    }
    this->area_ = (char *)0x0;
    this->area_free_ = 0;
    this->freelist_ = (void *)0x0;
    this->inited = true;
  }
  else {
    pSVar1 = (Span *)this->freelist_;
    if (pSVar1 != (Span *)0x0) {
      this->freelist_ = pSVar1->prev;
      return pSVar1;
    }
  }
  pSVar1 = AllocFromArea(this);
  return pSVar1;
}

Assistant:

T *Alloc() {
        if (!inited) {
            assert(construct);
            Init();
        }
        if (freelist_ != nullptr) {
            return AllocFromFreeList();
        }
        return AllocFromArea();
    }